

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crn_symbol_codec.cpp
# Opt level: O0

void __thiscall
crnlib::symbol_codec::encode(symbol_codec *this,uint sym,adaptive_huffman_data_model *model)

{
  ushort uVar1;
  uint uVar2;
  unsigned_short *puVar3;
  byte *pbVar4;
  uint freq;
  adaptive_huffman_data_model *model_local;
  uint sym_local;
  symbol_codec *this_local;
  
  puVar3 = vector<unsigned_short>::operator[](&model->m_codes,sym);
  uVar1 = *puVar3;
  pbVar4 = vector<unsigned_char>::operator[](&model->m_code_sizes,sym);
  record_put_bits(this,(uint)uVar1,(uint)*pbVar4);
  puVar3 = vector<unsigned_short>::operator[](&model->m_sym_freq,sym);
  uVar1 = *puVar3;
  puVar3 = vector<unsigned_short>::operator[](&model->m_sym_freq,sym);
  *puVar3 = (unsigned_short)(uVar1 + 1);
  if (uVar1 + 1 == 0xffff) {
    adaptive_huffman_data_model::rescale(model);
  }
  uVar2 = model->m_symbols_until_update - 1;
  model->m_symbols_until_update = uVar2;
  if (uVar2 == 0) {
    this->m_total_model_updates = this->m_total_model_updates + 1;
    adaptive_huffman_data_model::update(model);
  }
  return;
}

Assistant:

void symbol_codec::encode(uint sym, adaptive_huffman_data_model& model) {
  CRNLIB_ASSERT(m_mode == cEncoding);
  CRNLIB_ASSERT(model.m_encoding);

  record_put_bits(model.m_codes[sym], model.m_code_sizes[sym]);

  uint freq = model.m_sym_freq[sym];
  freq++;
  model.m_sym_freq[sym] = static_cast<uint16>(freq);

  if (freq == cUINT16_MAX)
    model.rescale();

  if (--model.m_symbols_until_update == 0) {
    m_total_model_updates++;
    model.update();
  }
}